

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O2

bool __thiscall
vkt::shaderexecutor::BitfieldInsertCaseInstance::compare
          (BitfieldInsertCaseInstance *this,void **inputs,void **outputs)

{
  uint uVar1;
  pointer pSVar2;
  uint uVar3;
  ulong uVar4;
  ostream *poVar5;
  Hex<8UL> hex;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  
  pSVar2 = (this->super_IntegerFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = *(uint *)((long)&(pSVar2->varType).m_data + 4);
  uVar3 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  uVar6 = ~(-1 << ((byte)*inputs[3] & 0x1f));
  if (*inputs[3] == 0x20) {
    uVar6 = 0xffffffff;
  }
  uVar7 = 0;
  uVar4 = 0;
  if (0 < (int)uVar3) {
    uVar4 = (ulong)uVar3;
  }
  do {
    if (uVar4 == uVar7) {
LAB_007a93ac:
      return (long)(int)uVar3 <= (long)uVar7;
    }
    uVar8 = (*(uint *)((long)inputs[1] + uVar7 * 4) & uVar6) << ((byte)*inputs[2] & 0x1f) |
            *(uint *)((long)*inputs + uVar7 * 4) & ~(uVar6 << ((byte)*inputs[2] & 0x1f));
    if (((*(uint *)((long)*outputs + uVar7 * 4) ^ uVar8) &
        (2 << ((&DAT_009f53e8)[(ulong)uVar1 * 4] - 1 & 0x1f)) - 1U) != 0) {
      poVar5 = std::operator<<((ostream *)&(this->super_IntegerFunctionTestInstance).m_failMsg,
                               "Expected [");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)uVar7);
      poVar5 = std::operator<<(poVar5,"] = ");
      hex.value._4_4_ = 0;
      hex.value._0_4_ = uVar8;
      tcu::Format::operator<<(poVar5,hex);
      goto LAB_007a93ac;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const deUint32			cmpMask			= getLowBitMask(integerLength);
		const int				offset			= *((const int*)inputs[2]);
		const int				bits			= *((const int*)inputs[3]);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	base	= ((const deUint32*)inputs[0])[compNdx];
			const deUint32	insert	= ((const deUint32*)inputs[1])[compNdx];
			const deInt32	out		= ((const deUint32*)outputs[0])[compNdx];

			const deUint32	mask	= bits == 32 ? ~0u : (1u<<bits)-1;
			const deUint32	ref		= (base & ~(mask<<offset)) | ((insert & mask)<<offset);

			if ((out&cmpMask) != (ref&cmpMask))
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref);
				return false;
			}
		}

		return true;
	}